

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O2

UMat * __thiscall
FlickerRemover::removeFlickering(FlickerRemover *this,UMat *frame,double timestamp,string *error)

{
  double dVar1;
  int iVar2;
  int iVar3;
  OpenCLKernels *this_00;
  pointer pUVar4;
  string error_00;
  FlickerRemover *pFVar5;
  CircularBuffer<cv::UMat_*> *this_01;
  bool bVar6;
  UMat *src_2;
  _InputArray *p_Var7;
  UMat *pUVar8;
  UMat *pUVar9;
  UMat *pUVar10;
  long lVar11;
  string *this_02;
  long lVar12;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  FlickerRemover *local_190;
  CircularBuffer<cv::UMat_*> *local_188;
  UMat *local_180;
  UMat *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  
  iVar2 = *(int *)(frame + 8);
  iVar3 = *(int *)(frame + 0xc);
  if ((iVar2 == this->frame_rows) && (iVar3 == this->frame_cols)) {
    dVar1 = this->expected_timestamp;
    if (((dVar1 != -1.0) || (NAN(dVar1))) &&
       (this->accepted_timestamp_difference <= ABS(dVar1 - timestamp))) {
      if (timestamp < dVar1) {
        std::__cxx11::to_string(&local_150,timestamp);
        std::operator+(&local_1d0,"Received unexpected timestamp: ",&local_150);
        std::operator+(&local_1b0,&local_1d0," Expected value close to: ");
        std::__cxx11::to_string(&local_170,this->expected_timestamp);
        std::operator+(&local_1f0,&local_1b0,&local_170);
        std::__cxx11::string::operator=((string *)error,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        this_02 = &local_150;
        goto LAB_001120dc;
      }
      this->actual_mask =
           ((int)(long)(((timestamp - dVar1) + this->accepted_timestamp_difference) /
                       this->timestamps_delta) + this->actual_mask) % (this->number_of_masks + 1);
      this->expected_timestamp = timestamp;
    }
    this->expected_timestamp = timestamp + this->timestamps_delta;
    src_2 = (UMat *)operator_new(0x50);
    cv::UMat::UMat(src_2,iVar2,iVar3,0);
    if (this->actual_mask == this->number_of_masks) {
      this->actual_mask = 0;
      local_1f0.field_2._M_allocated_capacity = 0;
      local_1f0._M_dataplus._M_p._0_4_ = 0x20a0000;
      local_1f0._M_string_length = (size_type)src_2;
      cv::UMat::convertTo((_OutputArray *)frame,(int)&local_1f0,1.0,0.0);
    }
    else {
      local_1f0.field_2._M_allocated_capacity = 0;
      local_1f0._M_dataplus._M_p._0_4_ = 0x10a0000;
      local_1b0._M_string_length =
           (size_type)
           ((this->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
            super__Vector_impl_data._M_start + (ulong)this->actual_mask * 0x50);
      local_1b0.field_2._M_allocated_capacity = 0;
      local_1d0.field_2._M_allocated_capacity = 0;
      local_1b0._M_dataplus._M_p._0_4_ = 0x10a0000;
      local_1d0._M_dataplus._M_p._0_4_ = 0x20a0000;
      local_1f0._M_string_length = (size_type)frame;
      local_1d0._M_string_length = (size_type)src_2;
      p_Var7 = (_InputArray *)cv::noArray();
      cv::subtract((_InputArray *)&local_1f0,(_InputArray *)&local_1b0,(_OutputArray *)&local_1d0,
                   p_Var7,0);
      this->actual_mask = this->actual_mask + 1;
    }
    if (((this->frames_block).count_of_elements != 0) &&
       (pUVar10 = (this->frames_block).data[(this->frames_block).last_element_index],
       pUVar10 != (UMat *)0x0)) {
      pUVar8 = (UMat *)operator_new(0x50);
      iVar2 = this->frame_rows;
      iVar3 = this->frame_cols;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&local_1f0,0.0);
      cv::UMat::UMat(pUVar8,iVar2,iVar3,0,&local_1f0,0);
      pUVar9 = CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar8);
      bVar6 = OpenCLKernels::runKernelUpdateSimilarityLevels
                        (this->opencl_kernels,pUVar10,src_2,pUVar9,this->flickering_threshold,pUVar8
                         ,&this->adjacent_frames_similarity_sum,error);
      cv::UMat::~UMat(pUVar9);
      operator_delete(pUVar9,0x50);
      if (!bVar6) {
        cv::UMat::~UMat(src_2);
        operator_delete(src_2,0x50);
        return (UMat *)0x0;
      }
    }
    local_188 = &this->frames_block;
    pUVar10 = CircularBuffer<cv::UMat_*>::push(local_188,src_2);
    if (pUVar10 != (UMat *)0x0) {
      pUVar8 = (UMat *)operator_new(0x50);
      iVar2 = this->frame_rows;
      iVar3 = this->frame_cols;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&local_1f0,0.0);
      cv::UMat::UMat(pUVar8,iVar2,iVar3,0,&local_1f0,0);
      pUVar9 = CircularBuffer<cv::UMat_*>::push
                         (&this->corresponding_frames_similarity_levels,pUVar8);
      bVar6 = OpenCLKernels::runKernelUpdateSimilarityLevels
                        (this->opencl_kernels,pUVar10,src_2,pUVar9,this->flickering_threshold,pUVar8
                         ,&this->corresponding_frames_similarity_sum,error);
      cv::UMat::~UMat(pUVar9);
      operator_delete(pUVar9,0x50);
      if (!bVar6) {
        return (UMat *)0x0;
      }
    }
    if (this->actual_mask != this->number_of_masks) {
      return src_2;
    }
    if ((this->frames_block).count_of_elements != (this->frames_block).count_of_slots) {
      return src_2;
    }
    pUVar10 = &this->flicker_counter;
    bVar6 = OpenCLKernels::runKernelUpdateFlickerCounter
                      (this->opencl_kernels,&this->adjacent_frames_similarity_sum,this->actual_mask,
                       &this->corresponding_frames_similarity_sum,(float)this->block_size * 0.7,
                       pUVar10,error);
    if (bVar6) {
      lVar11 = 0;
      lVar12 = 0;
      local_190 = this;
      while (this_01 = local_188, pFVar5 = local_190, this_00 = local_190->opencl_kernels,
            lVar12 < (int)local_190->number_of_masks) {
        local_178 = CircularBuffer<cv::UMat_*>::operator[](local_188,0);
        local_180 = CircularBuffer<cv::UMat_*>::operator[](this_01,(int)lVar12 + 1);
        iVar2 = pFVar5->max_allowed_flicker_duration;
        pUVar4 = (pFVar5->masks).super__Vector_base<cv::UMat,_std::allocator<cv::UMat>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0x112441;
        std::__cxx11::string::string(local_50,(string *)error);
        error_00._M_string_length = uVar13;
        error_00._M_dataplus._M_p = (pointer)local_50;
        error_00.field_2._M_allocated_capacity = in_stack_fffffffffffffde8;
        error_00.field_2._8_8_ = src_2;
        bVar6 = OpenCLKernels::runKernelUpdateMasks
                          (this_00,local_178,local_180,pUVar10,iVar2,pUVar4 + lVar11,error_00);
        std::__cxx11::string::~string(local_50);
        lVar11 = lVar11 + 0x50;
        lVar12 = lVar12 + 1;
        if (!bVar6) {
          return (UMat *)0x0;
        }
      }
      bVar6 = OpenCLKernels::runKernelZeroFlickerCounter
                        (this_00,local_190->max_allowed_flicker_duration,pUVar10,error);
      if (bVar6) {
        return src_2;
      }
    }
  }
  else {
    std::__cxx11::to_string(&local_70,iVar3);
    std::operator+(&local_d0,"Flickering cannot be removed. Size of the frame: ",&local_70);
    std::operator+(&local_b0,&local_d0,"x");
    std::__cxx11::to_string(&local_f0,*(int *)(frame + 8));
    std::operator+(&local_90,&local_b0,&local_f0);
    std::operator+(&local_170,&local_90," is different than expected: ");
    std::__cxx11::to_string(&local_110,this->frame_cols);
    std::operator+(&local_150,&local_170,&local_110);
    std::operator+(&local_1d0,&local_150,"x");
    std::__cxx11::to_string(&local_130,this->frame_rows);
    std::operator+(&local_1b0,&local_1d0,&local_130);
    std::operator+(&local_1f0,&local_1b0,".");
    std::__cxx11::string::operator=((string *)error,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    this_02 = &local_70;
LAB_001120dc:
    std::__cxx11::string::~string((string *)this_02);
  }
  return (UMat *)0x0;
}

Assistant:

UMat *FlickerRemover::removeFlickering(const UMat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new UMat(frame_rows, frame_cols, CV_8UC1);

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_8UC1);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_8UC1);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_adjacent_similarity = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_adjacent_similarity = adjacent_frames_similarity_levels.push(new_adjacent_similarity);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*last_frame, *frame_copy, *old_adjacent_similarity,
                                                                  flickering_threshold, *new_adjacent_similarity,
                                                                  adjacent_frames_similarity_sum, error);
        delete old_adjacent_similarity;
        if(!ret) {
            delete frame_copy;
            return nullptr;
        }
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*prev_frame, *frame_copy, *old_similarity_levels,
                                                                  flickering_threshold, *new_similarity_levels,
                                                                  corresponding_frames_similarity_sum, error);
        delete old_similarity_levels;
        if(!ret) {
            return nullptr;
        }
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        auto ret = opencl_kernels.runKernelUpdateFlickerCounter(adjacent_frames_similarity_sum, number_of_masks,
                                                                corresponding_frames_similarity_sum,
                                                                0.7f * (float) block_size, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
        for(int i = 0; i < (int) number_of_masks; i++) {
            ret = opencl_kernels.runKernelUpdateMasks(*(frames_block[0]), *(frames_block[i + 1]), flicker_counter,
                                                      max_allowed_flicker_duration, masks[i], error);
            if(!ret) {
                return nullptr;
            }
        }
        ret = opencl_kernels.runKernelZeroFlickerCounter(max_allowed_flicker_duration, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
    }
    return frame_copy;
}